

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall cereal::JSONInputArchive::Iterator::search(Iterator *this,char *searchName)

{
  int iVar1;
  size_t __n;
  Ch *__s2;
  size_t sVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  size_t sVar5;
  Pointer this_01;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = strlen(searchName);
  this_01 = (this->itsMemberItBegin).ptr_;
  if ((this->itsMemberItEnd).ptr_ != this_01) {
    sVar5 = 0;
    do {
      __s2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(&this_01->name);
      iVar1 = strncmp(searchName,__s2,__n);
      if (iVar1 == 0) {
        sVar2 = strlen(__s2);
        if (sVar2 == __n) {
          this->itsIndex = sVar5;
          return;
        }
      }
      this_01 = this_01 + 1;
      sVar5 = sVar5 + 1;
    } while (this_01 != (this->itsMemberItEnd).ptr_);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,searchName,&local_91);
  std::operator+(&local_50,"JSON Parsing failed - provided NVP (",&local_90);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_70 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_70);
  *(undefined ***)this_00 = &PTR__runtime_error_001d4d38;
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void search( const char * searchName )
          {
            const auto len = std::strlen( searchName );
            size_t index = 0;
            for( auto it = itsMemberItBegin; it != itsMemberItEnd; ++it, ++index )
            {
              const auto currentName = it->name.GetString();
              if( ( std::strncmp( searchName, currentName, len ) == 0 ) &&
                  ( std::strlen( currentName ) == len ) )
              {
                itsIndex = index;
                return;
              }
            }

            throw Exception("JSON Parsing failed - provided NVP (" + std::string(searchName) + ") not found");
          }